

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerGLSL::emit_unary_func_op_cast
          (CompilerGLSL *this,uint32_t result_type,uint32_t result_id,uint32_t op0,char *op,
          BaseType input_type,BaseType expected_result_type)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  BaseType BVar2;
  string *psVar3;
  bool forwarding;
  SPIRType *pSVar4;
  SPIRType *pSVar5;
  undefined4 in_register_0000008c;
  char (*ts_3) [2];
  string expr;
  string cast_op;
  SPIRType expected_type;
  string local_210;
  string local_1f0;
  uint32_t local_1cc;
  char *local_1c8;
  undefined1 *local_1c0;
  undefined8 local_1b8;
  undefined1 local_1b0 [16];
  string local_1a0;
  undefined1 local_180 [192];
  uint *local_c0;
  size_t local_b8;
  uint local_a8 [16];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  ts_3 = (char (*) [2])CONCAT44(in_register_0000008c,input_type);
  local_1cc = result_type;
  local_1c8 = op;
  pSVar4 = Variant::get<spirv_cross::SPIRType>
                     ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                      result_type);
  pSVar5 = Compiler::expression_type(&this->super_Compiler,op0);
  SPIRType::SPIRType((SPIRType *)local_180,pSVar4);
  local_180._16_4_ = pSVar5->width;
  local_1c0 = local_1b0;
  local_1b8 = 0;
  local_1b0[0] = 0;
  BVar2 = *(BaseType *)&(pSVar5->super_IVariant).field_0xc;
  local_180._12_4_ = input_type;
  if (BVar2 == input_type) {
    to_unpacked_expression_abi_cxx11_(&local_1f0,this,op0,true);
  }
  else {
    if (BVar2 == Boolean) {
      (*(this->super_Compiler)._vptr_Compiler[0x13])(&local_210,this,local_180,0);
      to_unpacked_expression_abi_cxx11_(&local_1a0,this,op0,true);
      join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                (&local_1f0,(spirv_cross *)&local_210,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x35f5ef,
                 (char (*) [2])&local_1a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3482a8,ts_3)
      ;
      ::std::__cxx11::string::operator=((string *)&local_1c0,(string *)&local_1f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
        operator_delete(local_1a0._M_dataplus._M_p);
      }
      psVar3 = &local_210;
      local_1f0._M_dataplus._M_p = local_210._M_dataplus._M_p;
      goto LAB_001f0280;
    }
    bitcast_glsl_abi_cxx11_(&local_1f0,this,(SPIRType *)local_180,op0);
  }
  ::std::__cxx11::string::operator=((string *)&local_1c0,(string *)&local_1f0);
  psVar3 = &local_1f0;
LAB_001f0280:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &psVar3->field_2) {
    operator_delete(local_1f0._M_dataplus._M_p);
  }
  paVar1 = &local_1f0.field_2;
  local_1f0._M_string_length = 0;
  local_1f0.field_2._M_local_buf[0] = '\0';
  local_1f0._M_dataplus._M_p = (pointer)paVar1;
  if (*(BaseType *)&(pSVar4->super_IVariant).field_0xc == expected_result_type) {
    join<char_const*&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
              (&local_210,(spirv_cross *)&local_1c8,(char **)0x35f5ef,(char (*) [2])&local_1c0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3482a8,ts_3);
    ::std::__cxx11::string::_M_append((char *)&local_1f0,(ulong)local_210._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p);
    }
  }
  else {
    local_180._12_4_ = expected_result_type;
    local_180._16_4_ = pSVar4->width;
    if (*(int *)&(pSVar4->super_IVariant).field_0xc == 2) {
      (*(this->super_Compiler)._vptr_Compiler[0x13])(&local_210,this,pSVar4,0);
    }
    else {
      (*(this->super_Compiler)._vptr_Compiler[0x38])(&local_210,this,pSVar4,local_180);
    }
    ::std::__cxx11::string::operator=((string *)&local_1f0,(string *)&local_210);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p);
    }
    ::std::__cxx11::string::push_back((char)&local_1f0);
    join<char_const*&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
              (&local_210,(spirv_cross *)&local_1c8,(char **)0x35f5ef,(char (*) [2])&local_1c0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3482a8,ts_3);
    ::std::__cxx11::string::_M_append((char *)&local_1f0,(ulong)local_210._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p);
    }
    ::std::__cxx11::string::push_back((char)&local_1f0);
  }
  forwarding = should_forward(this,op0);
  emit_op(this,local_1cc,result_id,&local_1f0,forwarding,false);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,result_id,op0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1f0._M_dataplus._M_p);
  }
  if (local_1c0 != local_1b0) {
    operator_delete(local_1c0);
  }
  local_180._0_8_ = &PTR__SPIRType_003d8230;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_68);
  local_b8 = 0;
  if (local_c0 != local_a8) {
    free(local_c0);
  }
  local_180._144_8_ = 0;
  if ((TypedID<(spirv_cross::Types)1> *)local_180._136_8_ !=
      (TypedID<(spirv_cross::Types)1> *)(local_180 + 0xa0)) {
    free((void *)local_180._136_8_);
  }
  local_180._96_8_ = 0;
  if ((undefined1 *)local_180._88_8_ != local_180 + 0x70) {
    free((void *)local_180._88_8_);
  }
  local_180._40_8_ = 0;
  if ((undefined1 *)local_180._32_8_ != local_180 + 0x38) {
    free((void *)local_180._32_8_);
  }
  return;
}

Assistant:

void CompilerGLSL::emit_unary_func_op_cast(uint32_t result_type, uint32_t result_id, uint32_t op0, const char *op,
                                           SPIRType::BaseType input_type, SPIRType::BaseType expected_result_type)
{
	auto &out_type = get<SPIRType>(result_type);
	auto &expr_type = expression_type(op0);
	auto expected_type = out_type;

	// Bit-widths might be different in unary cases because we use it for SConvert/UConvert and friends.
	expected_type.basetype = input_type;
	expected_type.width = expr_type.width;

	string cast_op;
	if (expr_type.basetype != input_type)
	{
		if (expr_type.basetype == SPIRType::Boolean)
			cast_op = join(type_to_glsl(expected_type), "(", to_unpacked_expression(op0), ")");
		else
			cast_op = bitcast_glsl(expected_type, op0);
	}
	else
		cast_op = to_unpacked_expression(op0);

	string expr;
	if (out_type.basetype != expected_result_type)
	{
		expected_type.basetype = expected_result_type;
		expected_type.width = out_type.width;
		if (out_type.basetype == SPIRType::Boolean)
			expr = type_to_glsl(out_type);
		else
			expr = bitcast_glsl_op(out_type, expected_type);
		expr += '(';
		expr += join(op, "(", cast_op, ")");
		expr += ')';
	}
	else
	{
		expr += join(op, "(", cast_op, ")");
	}

	emit_op(result_type, result_id, expr, should_forward(op0));
	inherit_expression_dependencies(result_id, op0);
}